

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sLongRunningTests.cpp
# Opt level: O1

int __thiscall deqp::gles3::Stress::LongRunningTests::init(LongRunningTests *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int maxBufMemoryUsageBytes;
  Context *pCVar2;
  RenderContext *pRVar3;
  TestContext *testCtx;
  _func_int **pp_Var4;
  Case *pCVar5;
  Case_conflict *pCVar6;
  ulong *name;
  ulong *desc;
  int extraout_EAX;
  TestNode *pTVar7;
  LongStressCase *pLVar8;
  long *plVar9;
  TestContext *pTVar10;
  TestNode *pTVar11;
  pointer pPVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  ulong *puVar14;
  pointer pPVar15;
  int iVar16;
  Probs *pPVar17;
  EVP_PKEY_CTX *pEVar18;
  undefined8 uVar19;
  long lVar20;
  FeatureProbabilities *pFVar21;
  long lVar22;
  bool bVar23;
  long local_238;
  ProgramLibrary progLib;
  ulong *local_228;
  long local_220;
  ulong local_218;
  long lStack_210;
  ulong *local_208;
  long local_200;
  ulong local_1f8;
  long lStack_1f0;
  ulong *local_1e8;
  long local_1e0;
  ulong local_1d8;
  long lStack_1d0;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8;
  long lStack_1b0;
  LongStressCase *local_1a8;
  TestNode *local_1a0;
  vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> contexts_2;
  allocator_type local_159;
  vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> contexts;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_> local_f8;
  vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_> local_e0;
  void *local_c8;
  long local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  LongStressCase *local_88;
  TestNode *local_80;
  vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> contexts_4;
  vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> local_48;
  
  pEVar18 = (EVP_PKEY_CTX *)&progLib;
  deqp::gls::LongStressTestUtil::ProgramLibrary::ProgramLibrary
            ((ProgramLibrary *)pEVar18,GLSL_VERSION_300_ES);
  if (init()::memoryLimitCases == '\0') {
    init(pEVar18);
  }
  deqp::gls::LongStressTestUtil::ProgramLibrary::generateBufferContext
            ((ProgramContext *)&local_138,&progLib,4);
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::vector
            (&contexts,1,(value_type *)&local_138,(allocator_type *)&contexts_2);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0._M_allocated_capacity + 1);
  }
  if (local_c8 != (void *)0x0) {
    operator_delete(local_c8,local_b8 - (long)local_c8);
  }
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_e0);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_f8);
  if (local_118 != &local_108) {
    operator_delete(local_118,
                    CONCAT44(local_108._M_allocated_capacity._4_4_,
                             local_108._M_allocated_capacity._0_4_) + 1);
  }
  uVar19 = local_138._M_allocated_capacity;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_allocated_capacity != &local_128) {
    operator_delete((void *)local_138._M_allocated_capacity,local_128._M_allocated_capacity + 1);
  }
  if (init()::cases == '\0') {
    init((EVP_PKEY_CTX *)uVar19);
  }
  pTVar7 = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,pCVar2->m_testCtx,"buffer","Buffer stress tests");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_0217f168;
  pTVar7[1]._vptr_TestNode = (_func_int **)pCVar2;
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  lVar20 = 0;
  local_1a0 = (TestNode *)this;
  local_80 = pTVar7;
  do {
    lVar22 = 5;
    pCVar5 = init::cases;
    do {
      pPVar17 = &pCVar5->probs;
      uVar1 = *(uint *)((long)(pPVar17 + -1) + 0x38);
      if ((int)uVar1 < 1) {
        uVar1 = init::memoryLimitCases[lVar20].redundantBufferFactor;
      }
      pLVar8 = (LongStressCase *)operator_new(0x178);
      pTVar10 = ((Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode)->m_testCtx;
      pRVar3 = ((Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode)->m_renderCtx;
      local_1e8 = &local_1d8;
      local_1e0 = 0;
      local_1d8 = local_1d8 & 0xffffffffffffff00;
      local_1a8 = (LongStressCase *)(ulong)uVar1;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_1e8);
      contexts_2.
      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)&contexts_2.
                     super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pPVar12 = (pointer)(plVar9 + 2);
      if ((pointer)*plVar9 == pPVar12) {
        contexts_2.
        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)(pPVar12->vertexSource)._M_dataplus._M_p;
      }
      else {
        contexts_2.
        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)(pPVar12->vertexSource)._M_dataplus._M_p;
        contexts_2.
        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar9;
      }
      contexts_2.
      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = (undefined4)plVar9[1];
      contexts_2.
      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)plVar9[1] >> 0x20);
      *plVar9 = (long)pPVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&contexts_2);
      local_138._M_allocated_capacity = (size_type)&local_128;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 == paVar13) {
        local_128._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_128._8_8_ = plVar9[3];
      }
      else {
        local_128._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_138._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar9;
      }
      uVar19 = local_138._M_allocated_capacity;
      local_138._8_8_ = plVar9[1];
      *plVar9 = (long)paVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      local_1c8 = &local_1b8;
      local_1c0 = 0;
      local_1b8 = local_1b8 & 0xffffffffffffff00;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_1c8);
      local_228 = &local_218;
      puVar14 = (ulong *)(plVar9 + 2);
      if ((ulong *)*plVar9 == puVar14) {
        local_218 = *puVar14;
        lStack_210 = plVar9[3];
      }
      else {
        local_218 = *puVar14;
        local_228 = (ulong *)*plVar9;
      }
      local_220 = plVar9[1];
      *plVar9 = (long)puVar14;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_228);
      local_208 = &local_1f8;
      puVar14 = (ulong *)(plVar9 + 2);
      if ((ulong *)*plVar9 == puVar14) {
        local_1f8 = *puVar14;
        lStack_1f0 = plVar9[3];
      }
      else {
        local_1f8 = *puVar14;
        local_208 = (ulong *)*plVar9;
      }
      local_200 = plVar9[1];
      *plVar9 = (long)puVar14;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      local_88 = (LongStressCase *)lVar22;
      deqp::gls::LongStressCase::LongStressCase
                (pLVar8,pTVar10,pRVar3,(char *)uVar19,(char *)local_208,0,
                 init::memoryLimitCases[lVar20].limit,1,50000,&contexts,pPVar17,0x88e8,0x88e8,
                 (int)local_1a8,false);
      tcu::TestNode::addChild(local_80,(TestNode *)pLVar8);
      if (local_208 != &local_1f8) {
        operator_delete(local_208,local_1f8 + 1);
      }
      this = (LongRunningTests *)local_1a0;
      if (local_228 != &local_218) {
        operator_delete(local_228,local_218 + 1);
      }
      if (local_1c8 != &local_1b8) {
        operator_delete(local_1c8,local_1b8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_allocated_capacity != &local_128) {
        operator_delete((void *)local_138._M_allocated_capacity,local_128._M_allocated_capacity + 1)
        ;
      }
      if (contexts_2.
          super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (pointer)&contexts_2.
                    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(contexts_2.
                        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((contexts_2.
                                         super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       vertexSource)._M_dataplus._M_p + 1));
      }
      pLVar8 = local_88;
      if (local_1e8 != &local_1d8) {
        operator_delete(local_1e8,local_1d8 + 1);
      }
      pCVar5 = (Case *)(pPVar17 + 1);
      lVar22 = (long)pLVar8 + -1;
    } while (lVar22 != 0);
    bVar23 = lVar20 == 0;
    lVar20 = lVar20 + 1;
  } while (bVar23);
  pEVar18 = (EVP_PKEY_CTX *)&contexts;
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::~vector
            ((vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> *)
             pEVar18);
  if (init()::memoryLimitCases == '\0') {
    init(pEVar18);
  }
  if (init()::cases == '\0') {
    init(pEVar18);
  }
  pLVar8 = (LongStressCase *)operator_new(0x78);
  pRVar3 = (RenderContext *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pLVar8,(TestContext *)pRVar3->_vptr_RenderContext,"texture",
             "Texture stress tests");
  (pLVar8->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_0217f168;
  pLVar8->m_renderCtx = pRVar3;
  local_88 = pLVar8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar8);
  pTVar10 = (TestContext *)0x0;
  do {
    lVar20 = 4;
    pCVar6 = init()::cases;
    local_80 = (TestNode *)pTVar10;
    do {
      pPVar17 = &pCVar6->probs;
      iVar16 = *(int *)((long)(pPVar17 + -1) + 0x38);
      if (iVar16 < 1) {
        iVar16 = init()::memoryLimitCases[(long)pTVar10].numTextures;
      }
      deqp::gls::LongStressTestUtil::ProgramLibrary::generateTextureContext
                ((ProgramContext *)&local_138,&progLib,iVar16,0x200,0x200,0.1);
      std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::vector
                (&contexts,1,(value_type *)&local_138,(allocator_type *)&contexts_2);
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,local_a0._M_allocated_capacity + 1);
      }
      if (local_c8 != (void *)0x0) {
        operator_delete(local_c8,local_b8 - (long)local_c8);
      }
      std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_e0);
      std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_f8);
      if (local_118 != &local_108) {
        operator_delete(local_118,
                        CONCAT44(local_108._M_allocated_capacity._4_4_,
                                 local_108._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_allocated_capacity != &local_128) {
        operator_delete((void *)local_138._M_allocated_capacity,local_128._M_allocated_capacity + 1)
        ;
      }
      local_1a8 = (LongStressCase *)operator_new(0x178);
      testCtx = (TestContext *)*((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      pRVar3 = (RenderContext *)((TestNode *)((long)this + 0x70))->_vptr_TestNode[1];
      local_1e8 = &local_1d8;
      local_1e0 = 0;
      local_1d8 = local_1d8 & 0xffffffffffffff00;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_1e8);
      contexts_2.
      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)&contexts_2.
                     super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pPVar12 = (pointer)(plVar9 + 2);
      if ((pointer)*plVar9 == pPVar12) {
        contexts_2.
        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)(pPVar12->vertexSource)._M_dataplus._M_p;
      }
      else {
        contexts_2.
        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)(pPVar12->vertexSource)._M_dataplus._M_p;
        contexts_2.
        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar9;
      }
      contexts_2.
      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = (undefined4)plVar9[1];
      contexts_2.
      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)plVar9[1] >> 0x20);
      *plVar9 = (long)pPVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&contexts_2);
      local_138._M_allocated_capacity = (size_type)&local_128;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 == paVar13) {
        local_128._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_128._8_8_ = plVar9[3];
      }
      else {
        local_128._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_138._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar9;
      }
      uVar19 = local_138._M_allocated_capacity;
      local_138._8_8_ = plVar9[1];
      *plVar9 = (long)paVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      local_1c8 = &local_1b8;
      local_1c0 = 0;
      local_1b8 = local_1b8 & 0xffffffffffffff00;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_1c8);
      local_228 = &local_218;
      puVar14 = (ulong *)(plVar9 + 2);
      if ((ulong *)*plVar9 == puVar14) {
        local_218 = *puVar14;
        lStack_210 = plVar9[3];
      }
      else {
        local_218 = *puVar14;
        local_228 = (ulong *)*plVar9;
      }
      local_220 = plVar9[1];
      *plVar9 = (long)puVar14;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_228);
      pLVar8 = local_1a8;
      local_208 = &local_1f8;
      puVar14 = (ulong *)(plVar9 + 2);
      if ((ulong *)*plVar9 == puVar14) {
        local_1f8 = *puVar14;
        lStack_1f0 = plVar9[3];
      }
      else {
        local_1f8 = *puVar14;
        local_208 = (ulong *)*plVar9;
      }
      local_200 = plVar9[1];
      *plVar9 = (long)puVar14;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      deqp::gls::LongStressCase::LongStressCase
                (local_1a8,testCtx,pRVar3,(char *)uVar19,(char *)local_208,
                 init()::memoryLimitCases[(long)pTVar10].limit,0x100000,1,10000,&contexts,pPVar17,
                 0x88e4,0x88e4,1,false);
      tcu::TestNode::addChild((TestNode *)local_88,(TestNode *)pLVar8);
      if (local_208 != &local_1f8) {
        operator_delete(local_208,local_1f8 + 1);
      }
      this = (LongRunningTests *)local_1a0;
      if (local_228 != &local_218) {
        operator_delete(local_228,local_218 + 1);
      }
      if (local_1c8 != &local_1b8) {
        operator_delete(local_1c8,local_1b8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_allocated_capacity != &local_128) {
        operator_delete((void *)local_138._M_allocated_capacity,local_128._M_allocated_capacity + 1)
        ;
      }
      if (contexts_2.
          super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (pointer)&contexts_2.
                    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(contexts_2.
                        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((contexts_2.
                                         super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       vertexSource)._M_dataplus._M_p + 1));
      }
      if (local_1e8 != &local_1d8) {
        operator_delete(local_1e8,local_1d8 + 1);
      }
      std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::~vector
                (&contexts);
      pCVar6 = (Case_conflict *)(pPVar17 + 1);
      lVar20 = lVar20 + -1;
    } while (lVar20 != 0);
    pTVar10 = (TestContext *)((long)&local_80->_vptr_TestNode + 1);
  } while (local_80 == (TestNode *)0x0);
  deqp::gls::LongStressTestUtil::ProgramLibrary::generateTextureContext
            ((ProgramContext *)&local_138,&progLib,1,0x80,0x80,0.5);
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::vector
            (&contexts_2,1,(value_type *)&local_138,(allocator_type *)&local_1e8);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0._M_allocated_capacity + 1);
  }
  if (local_c8 != (void *)0x0) {
    operator_delete(local_c8,local_b8 - (long)local_c8);
  }
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_e0);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_f8);
  if (local_118 != &local_108) {
    operator_delete(local_118,
                    CONCAT44(local_108._M_allocated_capacity._4_4_,
                             local_108._M_allocated_capacity._0_4_) + 1);
  }
  uVar19 = local_138._M_allocated_capacity;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_allocated_capacity != &local_128) {
    operator_delete((void *)local_138._M_allocated_capacity,local_128._M_allocated_capacity + 1);
  }
  if (init()::cases == '\0') {
    init((EVP_PKEY_CTX *)uVar19);
  }
  pTVar7 = (TestNode *)operator_new(0x78);
  pp_Var4 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,(TestContext *)*pp_Var4,"draw_call","Draw call stress tests");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_0217f168;
  pTVar7[1]._vptr_TestNode = pp_Var4;
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  pFVar21 = &init()::cases[0].probs;
  lVar20 = 4;
  do {
    pLVar8 = (LongStressCase *)operator_new(0x178);
    deqp::gls::LongStressCase::LongStressCase
              (pLVar8,((Context *)local_1a0[1]._vptr_TestNode)->m_testCtx,
               ((Context *)local_1a0[1]._vptr_TestNode)->m_renderCtx,
               *(char **)&pFVar21[-1].clientMemoryAttributeData,
               *(char **)&pFVar21[-1].randomBufferUploadTarget,0x100000,0x200000,
               (int)pFVar21[-1].useDrawArrays,(int)pFVar21[-1].separateAttributeBuffers,&contexts_2,
               pFVar21,0x88e4,0x88e4,1,false);
    tcu::TestNode::addChild(pTVar7,(TestNode *)pLVar8);
    pFVar21 = (FeatureProbabilities *)&pFVar21[1].wastefulTextureMemoryUsage;
    lVar20 = lVar20 + -1;
  } while (lVar20 != 0);
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::~vector
            (&contexts_2);
  contexts_2.
  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  contexts_2.
  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  contexts_2.
  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  contexts_2.
  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  contexts_2.
  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deqp::gls::LongStressTestUtil::ProgramLibrary::generateFragmentPointLightContext
            ((ProgramContext *)&local_138,&progLib,0x200,0x200);
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::
  emplace_back<deqp::gls::ProgramContext>(&contexts_2,(ProgramContext *)&local_138);
  pTVar7 = local_1a0;
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0._M_allocated_capacity + 1);
  }
  if (local_c8 != (void *)0x0) {
    operator_delete(local_c8,local_b8 - (long)local_c8);
  }
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_e0);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_f8);
  if (local_118 != &local_108) {
    operator_delete(local_118,
                    CONCAT44(local_108._M_allocated_capacity._4_4_,
                             local_108._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_allocated_capacity != &local_128) {
    operator_delete((void *)local_138._M_allocated_capacity,local_128._M_allocated_capacity + 1);
  }
  deqp::gls::LongStressTestUtil::ProgramLibrary::generateVertexUniformLoopLightContext
            ((ProgramContext *)&local_138,&progLib,0x200,0x200);
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::
  emplace_back<deqp::gls::ProgramContext>(&contexts_2,(ProgramContext *)&local_138);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0._M_allocated_capacity + 1);
  }
  if (local_c8 != (void *)0x0) {
    operator_delete(local_c8,local_b8 - (long)local_c8);
  }
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_e0);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_f8);
  if (local_118 != &local_108) {
    operator_delete(local_118,
                    CONCAT44(local_108._M_allocated_capacity._4_4_,
                             local_108._M_allocated_capacity._0_4_) + 1);
  }
  uVar19 = local_138._M_allocated_capacity;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_allocated_capacity != &local_128) {
    operator_delete((void *)local_138._M_allocated_capacity,local_128._M_allocated_capacity + 1);
  }
  if (init()::cases == '\0') {
    init((EVP_PKEY_CTX *)uVar19);
  }
  pTVar11 = (TestNode *)operator_new(0x78);
  pp_Var4 = pTVar7[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,(TestContext *)*pp_Var4,"program",
             "Shader program stress tests");
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_0217f168;
  pTVar11[1]._vptr_TestNode = pp_Var4;
  tcu::TestNode::addChild(pTVar7,pTVar11);
  lVar20 = 1;
  pFVar21 = &init()::cases[0].probs;
  do {
    pLVar8 = (LongStressCase *)operator_new(0x178);
    deqp::gls::LongStressCase::LongStressCase
              (pLVar8,(TestContext *)*local_1a0[1]._vptr_TestNode,
               (RenderContext *)local_1a0[1]._vptr_TestNode[1],
               *(char **)&pFVar21[-1].randomBufferUploadTarget,*(char **)&pFVar21[-1].useDrawArrays,
               0x300000,0x100000,1,10000,&contexts_2,pFVar21,0x88e4,0x88e4,1,false);
    tcu::TestNode::addChild(pTVar11,(TestNode *)pLVar8);
    pFVar21 = (FeatureProbabilities *)&pFVar21[1].deleteTexture;
    lVar20 = lVar20 + -1;
  } while (lVar20 == 0);
  pEVar18 = (EVP_PKEY_CTX *)&contexts_2;
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::~vector
            ((vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> *)
             pEVar18);
  if (init()::memoryLimitCases == '\0') {
    init(pEVar18);
  }
  pTVar11 = (TestNode *)operator_new(0x78);
  pTVar7 = local_1a0;
  pp_Var4 = local_1a0[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,(TestContext *)*pp_Var4,"mixed","Mixed stress tests");
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_0217f168;
  pTVar11[1]._vptr_TestNode = pp_Var4;
  tcu::TestNode::addChild(pTVar7,pTVar11);
  local_238 = 0;
  local_1a8 = (LongStressCase *)pTVar11;
  do {
    local_88 = (LongStressCase *)operator_new(0x178);
    pTVar10 = (TestContext *)*pTVar7[1]._vptr_TestNode;
    pRVar3 = (RenderContext *)pTVar7[1]._vptr_TestNode[1];
    local_228 = &local_218;
    local_220 = 0;
    local_218 = local_218 & 0xffffffffffffff00;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_228);
    local_208 = &local_1f8;
    puVar14 = (ulong *)(plVar9 + 2);
    if ((ulong *)*plVar9 == puVar14) {
      local_1f8 = *puVar14;
      lStack_1f0 = plVar9[3];
    }
    else {
      local_1f8 = *puVar14;
      local_208 = (ulong *)*plVar9;
    }
    local_200 = plVar9[1];
    *plVar9 = (long)puVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_208);
    local_1e8 = &local_1d8;
    puVar14 = (ulong *)(plVar9 + 2);
    if ((ulong *)*plVar9 == puVar14) {
      local_1d8 = *puVar14;
      lStack_1d0 = plVar9[3];
    }
    else {
      local_1d8 = *puVar14;
      local_1e8 = (ulong *)*plVar9;
    }
    name = local_1e8;
    local_1e0 = plVar9[1];
    *plVar9 = (long)puVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    contexts_4.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)&contexts_4.
                   super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    contexts_4.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    contexts_4.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)contexts_4.
                          super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    plVar9 = (long *)std::__cxx11::string::append((char *)&contexts_4);
    contexts.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)&contexts.
                   super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pPVar12 = (pointer)(plVar9 + 2);
    if ((pointer)*plVar9 == pPVar12) {
      contexts.
      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)(pPVar12->vertexSource)._M_dataplus._M_p;
    }
    else {
      contexts.
      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)(pPVar12->vertexSource)._M_dataplus._M_p;
      contexts.
      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar9;
    }
    contexts.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar9[1];
    *plVar9 = (long)pPVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&contexts);
    local_1c8 = &local_1b8;
    puVar14 = (ulong *)(plVar9 + 2);
    if ((ulong *)*plVar9 == puVar14) {
      local_1b8 = *puVar14;
      lStack_1b0 = plVar9[3];
    }
    else {
      local_1b8 = *puVar14;
      local_1c8 = (ulong *)*plVar9;
    }
    desc = local_1c8;
    local_1c0 = plVar9[1];
    *plVar9 = (long)puVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    iVar16 = *(int *)((long)&init()::memoryLimitCases[0].texLimit + local_238);
    maxBufMemoryUsageBytes = *(int *)((long)&init()::memoryLimitCases[0].bufLimit + local_238);
    local_80 = (TestNode *)pTVar10;
    deqp::gls::LongStressTestUtil::ProgramLibrary::generateBufferAndTextureContext
              ((ProgramContext *)&local_138,&progLib,4,0x200,0x200);
    std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::vector
              (&local_48,1,(value_type *)&local_138,&local_159);
    pLVar8 = local_88;
    contexts_2.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    contexts_2.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_start._4_4_ = 0x3e99999a;
    contexts_2.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x3e99999a;
    contexts_2.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0x3f000000;
    contexts_2.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x3e4ccccd3f000000;
    deqp::gls::LongStressCase::LongStressCase
              (local_88,(TestContext *)local_80,pRVar3,(char *)name,(char *)desc,iVar16,
               maxBufMemoryUsageBytes,1,10000,&local_48,(FeatureProbabilities *)&contexts_2,0x88e4,
               0x88e4,1,false);
    tcu::TestNode::addChild((TestNode *)local_1a8,(TestNode *)pLVar8);
    std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::~vector
              (&local_48);
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0._M_allocated_capacity + 1);
    }
    if (local_c8 != (void *)0x0) {
      operator_delete(local_c8,local_b8 - (long)local_c8);
    }
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_e0);
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_f8);
    if (local_118 != &local_108) {
      operator_delete(local_118,
                      CONCAT44(local_108._M_allocated_capacity._4_4_,
                               local_108._M_allocated_capacity._0_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_allocated_capacity != &local_128) {
      operator_delete((void *)local_138._M_allocated_capacity,local_128._M_allocated_capacity + 1);
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,local_1b8 + 1);
    }
    if (contexts.
        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pointer)&contexts.
                  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(contexts.
                      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((contexts.
                                       super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     vertexSource)._M_dataplus._M_p + 1));
    }
    if (contexts_4.
        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pointer)&contexts_4.
                  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(contexts_4.
                      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((contexts_4.
                                       super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     vertexSource)._M_dataplus._M_p + 1));
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8 + 1);
    }
    if (local_208 != &local_1f8) {
      operator_delete(local_208,local_1f8 + 1);
    }
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
    }
    contexts_4.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    contexts_4.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    contexts_4.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    deqp::gls::LongStressTestUtil::ProgramLibrary::generateFragmentPointLightContext
              ((ProgramContext *)&local_138,&progLib,0x200,0x200);
    std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::
    emplace_back<deqp::gls::ProgramContext>(&contexts_4,(ProgramContext *)&local_138);
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0._M_allocated_capacity + 1);
    }
    if (local_c8 != (void *)0x0) {
      operator_delete(local_c8,local_b8 - (long)local_c8);
    }
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_e0);
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_f8);
    if (local_118 != &local_108) {
      operator_delete(local_118,
                      CONCAT44(local_108._M_allocated_capacity._4_4_,
                               local_108._M_allocated_capacity._0_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_allocated_capacity != &local_128) {
      operator_delete((void *)local_138._M_allocated_capacity,local_128._M_allocated_capacity + 1);
    }
    deqp::gls::LongStressTestUtil::ProgramLibrary::generateVertexUniformLoopLightContext
              ((ProgramContext *)&local_138,&progLib,0x200,0x200);
    std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::
    emplace_back<deqp::gls::ProgramContext>(&contexts_4,(ProgramContext *)&local_138);
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0._M_allocated_capacity + 1);
    }
    if (local_c8 != (void *)0x0) {
      operator_delete(local_c8,local_b8 - (long)local_c8);
    }
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_e0);
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_f8);
    if (local_118 != &local_108) {
      operator_delete(local_118,
                      CONCAT44(local_108._M_allocated_capacity._4_4_,
                               local_108._M_allocated_capacity._0_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_allocated_capacity != &local_128) {
      operator_delete((void *)local_138._M_allocated_capacity,local_128._M_allocated_capacity + 1);
    }
    pLVar8 = (LongStressCase *)operator_new(0x178);
    pTVar10 = (TestContext *)*local_1a0[1]._vptr_TestNode;
    pRVar3 = (RenderContext *)local_1a0[1]._vptr_TestNode[1];
    local_208 = &local_1f8;
    local_200 = 0;
    local_1f8 = local_1f8 & 0xffffffffffffff00;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_208);
    local_1e8 = &local_1d8;
    puVar14 = (ulong *)(plVar9 + 2);
    if ((ulong *)*plVar9 == puVar14) {
      local_1d8 = *puVar14;
      lStack_1d0 = plVar9[3];
    }
    else {
      local_1d8 = *puVar14;
      local_1e8 = (ulong *)*plVar9;
    }
    local_1e0 = plVar9[1];
    *plVar9 = (long)puVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    pPVar12 = (pointer)&contexts_2.
                        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pPVar15 = (pointer)(plVar9 + 2);
    if ((pointer)*plVar9 == pPVar15) {
      contexts_2.
      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)(pPVar15->vertexSource)._M_dataplus._M_p;
    }
    else {
      contexts_2.
      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)(pPVar15->vertexSource)._M_dataplus._M_p;
      pPVar12 = (pointer)*plVar9;
    }
    contexts_2.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = (undefined4)plVar9[1];
    contexts_2.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)plVar9[1] >> 0x20);
    *plVar9 = (long)pPVar15;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    contexts.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)&contexts.
                   super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    contexts.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    contexts.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)contexts.
                          super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    contexts_2.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_start = pPVar12;
    plVar9 = (long *)std::__cxx11::string::append((char *)&contexts);
    local_1c8 = &local_1b8;
    puVar14 = (ulong *)(plVar9 + 2);
    if ((ulong *)*plVar9 == puVar14) {
      local_1b8 = *puVar14;
      lStack_1b0 = plVar9[3];
    }
    else {
      local_1b8 = *puVar14;
      local_1c8 = (ulong *)*plVar9;
    }
    local_1c0 = plVar9[1];
    *plVar9 = (long)puVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_1c8);
    local_228 = &local_218;
    puVar14 = (ulong *)(plVar9 + 2);
    if ((ulong *)*plVar9 == puVar14) {
      local_218 = *puVar14;
      lStack_210 = plVar9[3];
    }
    else {
      local_218 = *puVar14;
      local_228 = (ulong *)*plVar9;
    }
    local_220 = plVar9[1];
    *plVar9 = (long)puVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    local_138._M_allocated_capacity = 0x3e99999a3e99999a;
    local_138._8_8_ = 0x3e99999a3e99999a;
    local_128._M_allocated_capacity = 0x3e4ccccd3e99999a;
    local_128._8_8_ = 0x3e99999a3e4ccccd;
    local_118 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x3e4ccccd3e99999a;
    uStack_110 = 0x3e4ccccd;
    local_108._8_4_ = 0x3ecccccd;
    uStack_10c = 0x3f800000;
    local_108._M_allocated_capacity._0_4_ = 0x3f800000;
    local_108._M_allocated_capacity._4_4_ = 0x3ecccccd;
    deqp::gls::LongStressCase::LongStressCase
              (pLVar8,pTVar10,pRVar3,(char *)pPVar12,(char *)local_228,
               *(int *)((long)&init()::memoryLimitCases[0].texLimit + local_238),
               *(int *)((long)&init()::memoryLimitCases[0].bufLimit + local_238),1,10000,&contexts_4
               ,(FeatureProbabilities *)&local_138,0x88e4,0x88e4,1,false);
    tcu::TestNode::addChild((TestNode *)local_1a8,(TestNode *)pLVar8);
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
    }
    pTVar7 = local_1a0;
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,local_1b8 + 1);
    }
    if (contexts.
        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pointer)&contexts.
                  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(contexts.
                      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((contexts.
                                       super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     vertexSource)._M_dataplus._M_p + 1));
    }
    if (contexts_2.
        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pointer)&contexts_2.
                  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(contexts_2.
                      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((contexts_2.
                                       super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     vertexSource)._M_dataplus._M_p + 1));
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8 + 1);
    }
    if (local_208 != &local_1f8) {
      operator_delete(local_208,local_1f8 + 1);
    }
    std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::~vector
              (&contexts_4);
    local_238 = local_238 + 0x18;
  } while (local_238 == 0x18);
  return extraout_EAX;
}

Assistant:

void LongRunningTests::init (void)
{
	static const int								Mi			= 1<<20;
	const gls::LongStressTestUtil::ProgramLibrary	progLib		(glu::GLSL_VERSION_300_ES);

	typedef gls::LongStressCase::FeatureProbabilities Probs;

	// Buffer cases.

	{
		static const struct MemCase
		{
			const char* const	nameSuffix;
			const char* const	descSuffix;
			const int			limit;
			const int			redundantBufferFactor;
			MemCase (const char* n, const char* d, int l, int r) : nameSuffix(n), descSuffix(d), limit(l), redundantBufferFactor(r) {}
		} memoryLimitCases[] =
		{
			MemCase("_low_memory",	"; use a low buffer memory usage limit",	8*Mi,		2),
			MemCase("_high_memory",	"; use a high buffer memory usage limit",	256*Mi,		64)
		};

		const std::vector<gls::ProgramContext> contexts(1, progLib.generateBufferContext(4));

		static const struct Case
		{
			const char* const	name;
			const char*	const	desc;
			const int			redundantBufferFactor; //!< If non-positive, taken from memoryLimitCases.
			const Probs			probs;
			Case (const char* const name_, const char* const desc_, int bufFact, const Probs& probs_ = Probs()) : name(name_), desc(desc_), redundantBufferFactor(bufFact), probs(probs_) {}
		} cases[] =
		{
			Case("always_reupload",
				 "Re-upload buffer data at the beginning of each iteration",
				 -1,
				 Probs().pReuploadBuffer(1.0f)),

			Case("always_reupload_bufferdata",
				 "Re-upload buffer data at the beginning of each iteration, using glBufferData",
				 -1,
				 Probs().pReuploadBuffer(1.0f).pReuploadWithBufferData(1.0f)),

			Case("always_delete",
				 "Delete buffers at the end of each iteration, and re-create at the beginning of the next",
				 -1,
				 Probs().pDeleteBuffer(1.0f)),

			Case("wasteful",
				 "Don't reuse buffers, and only delete them when given memory limit is reached",
				 2,
				 Probs().pWastefulBufferMemoryUsage(1.0f)),

			Case("separate_attribute_buffers_wasteful",
				 "Give each vertex attribute its own buffer",
				 2,
				 Probs().pSeparateAttribBuffers(1.0f).pWastefulBufferMemoryUsage(1.0f))
		};

		TestCaseGroup* const bufferGroup = new TestCaseGroup(m_context, "buffer", "Buffer stress tests");
		addChild(bufferGroup);

		for (int memoryLimitNdx = 0; memoryLimitNdx < DE_LENGTH_OF_ARRAY(memoryLimitCases); memoryLimitNdx++)
		{
			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
			{
				const int redundantBufferFactor = cases[caseNdx].redundantBufferFactor > 0 ? cases[caseNdx].redundantBufferFactor : memoryLimitCases[memoryLimitNdx].redundantBufferFactor;

				bufferGroup->addChild(new gls::LongStressCase(m_context.getTestContext(), m_context.getRenderContext(),
															  (string() + cases[caseNdx].name + memoryLimitCases[memoryLimitNdx].nameSuffix).c_str(),
															  (string() + cases[caseNdx].desc + memoryLimitCases[memoryLimitNdx].descSuffix).c_str(),
															  0 /* tex memory */, memoryLimitCases[memoryLimitNdx].limit,
															  1 /* draw calls per iteration */, 50000 /* tris per call */,
															  contexts, cases[caseNdx].probs,
															  GL_DYNAMIC_DRAW, GL_DYNAMIC_DRAW,
															  redundantBufferFactor));
			}
		}
	}

	// Texture cases.

	{
		static const struct MemCase
		{
			const char* const	nameSuffix;
			const char* const	descSuffix;
			const int			limit;
			const int			numTextures;
			MemCase (const char* n, const char* d, int l, int t) : nameSuffix(n), descSuffix(d), limit(l), numTextures(t) {}
		} memoryLimitCases[] =
		{
			MemCase("_low_memory",	"; use a low texture memory usage limit",	8*Mi,		6),
			MemCase("_high_memory",	"; use a high texture memory usage limit",	256*Mi,		192)
		};

		static const struct Case
		{
			const char* const	name;
			const char* const	desc;
			const int			numTextures; //!< If non-positive, taken from memoryLimitCases.
			const Probs			probs;
			Case (const char* const name_, const char* const desc_, int numTextures_, const Probs& probs_ = Probs()) : name(name_), desc(desc_), numTextures(numTextures_), probs(probs_) {}
		} cases[] =
		{
			Case("always_reupload",
				 "Re-upload texture data at the beginning of each iteration",
				 -1,
				 Probs().pReuploadTexture(1.0f)),

			Case("always_reupload_teximage",
				 "Re-upload texture data at the beginning of each iteration, using glTexImage*",
				 -1,
				 Probs().pReuploadTexture(1.0f).pReuploadWithTexImage(1.0f)),

			Case("always_delete",
				 "Delete textures at the end of each iteration, and re-create at the beginning of the next",
				 -1,
				 Probs().pDeleteTexture(1.0f)),

			Case("wasteful",
				 "Don't reuse textures, and only delete them when given memory limit is reached",
				 6,
				 Probs().pWastefulTextureMemoryUsage(1.0f))
		};

		TestCaseGroup* const textureGroup = new TestCaseGroup(m_context, "texture", "Texture stress tests");
		addChild(textureGroup);

		for (int memoryLimitNdx = 0; memoryLimitNdx < DE_LENGTH_OF_ARRAY(memoryLimitCases); memoryLimitNdx++)
		{
			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
			{
				const int								numTextures		= cases[caseNdx].numTextures > 0 ? cases[caseNdx].numTextures : memoryLimitCases[memoryLimitNdx].numTextures;
				const std::vector<gls::ProgramContext>	contexts		(1, progLib.generateTextureContext(numTextures, 512, 512, 0.1f));

				textureGroup->addChild(new gls::LongStressCase(m_context.getTestContext(), m_context.getRenderContext(),
																(string() + cases[caseNdx].name + memoryLimitCases[memoryLimitNdx].nameSuffix).c_str(),
																(string() + cases[caseNdx].desc + memoryLimitCases[memoryLimitNdx].descSuffix).c_str(),
																memoryLimitCases[memoryLimitNdx].limit, 1*Mi /* buf memory */,
																1 /* draw calls per iteration */, 10000 /* tris per call */,
																contexts, cases[caseNdx].probs,
																GL_STATIC_DRAW, GL_STATIC_DRAW));
			}
		}
	}

	// Draw call cases.

	{
		const std::vector<gls::ProgramContext> contexts(1, progLib.generateTextureContext(1, 128, 128, 0.5f));

		static const struct Case
		{
			const char* const	name;
			const char* const	desc;
			const int			drawCallsPerIteration;
			const int			numTrisPerDrawCall;
			const Probs			probs;
			Case (const char* const name_, const char* const desc_, const int calls, const int tris, const Probs& probs_ = Probs())
				: name(name_), desc(desc_), drawCallsPerIteration(calls), numTrisPerDrawCall(tris), probs(probs_) {}
		} cases[] =
		{
			Case("client_memory_data",
				 "Use client-memory for index and attribute data, instead of GL buffers",
				 200, 500,
				 Probs().pClientMemoryAttributeData(1.0f).pClientMemoryIndexData(1.0f)),

			Case("vary_draw_function",
				 "Choose between glDrawElements and glDrawArrays each iteration, with uniform probability",
				 200, 500,
				 Probs().pUseDrawArrays(0.5f)),

			Case("few_big_calls",
				 "Per iteration, do a few draw calls with a big number of triangles per call",
				 2, 50000),

			Case("many_small_calls",
				 "Per iteration, do many draw calls with a small number of triangles per call",
				 2000, 50)
		};

		TestCaseGroup* const drawCallGroup = new TestCaseGroup(m_context, "draw_call", "Draw call stress tests");
		addChild(drawCallGroup);

		for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
		{
			drawCallGroup->addChild(new gls::LongStressCase(m_context.getTestContext(), m_context.getRenderContext(),
															cases[caseNdx].name, cases[caseNdx].desc,
															1*Mi /* tex memory */, 2*Mi /* buf memory */,
															cases[caseNdx].drawCallsPerIteration, cases[caseNdx].numTrisPerDrawCall,
															contexts, cases[caseNdx].probs,
															GL_STATIC_DRAW, GL_STATIC_DRAW));
		}
	}

	// Shader cases.

	{
		std::vector<gls::ProgramContext> contexts;
		contexts.push_back(progLib.generateFragmentPointLightContext(512, 512));
		contexts.push_back(progLib.generateVertexUniformLoopLightContext(512, 512));

		static const struct Case
		{
			const char* const	name;
			const char* const	desc;
			const Probs			probs;
			Case (const char* const name_, const char* const desc_, const Probs& probs_ = Probs()) : name(name_), desc(desc_), probs(probs_) {}
		} cases[] =
		{
			Case("several_programs",
				 "Use several different programs, choosing between them uniformly on each iteration"),

			Case("several_programs_always_rebuild",
				 "Use several different programs, choosing between them uniformly on each iteration, and always rebuild the program",
				 Probs().pRebuildProgram(1.0f))
		};

		TestCaseGroup* const shaderGroup = new TestCaseGroup(m_context, "program", "Shader program stress tests");
		addChild(shaderGroup);

		for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
		{
			shaderGroup->addChild(new gls::LongStressCase(m_context.getTestContext(), m_context.getRenderContext(),
														  cases[caseNdx].name, cases[caseNdx].desc,
														  3*Mi /* tex memory */, 1*Mi /* buf memory */,
														  1 /* draw calls per iteration */, 10000 /* tris per call */,
														  contexts, cases[caseNdx].probs,
														  GL_STATIC_DRAW, GL_STATIC_DRAW));
		}
	}

	// Mixed cases.

	{
		static const struct MemCase
		{
			const char* const	nameSuffix;
			const char* const	descSuffix;
			const int			texLimit;
			const int			bufLimit;
			MemCase (const char* n, const char* d, int t, int b) : nameSuffix(n), descSuffix(d), texLimit(t), bufLimit(b) {}
		} memoryLimitCases[] =
		{
			MemCase("_low_memory",	"; use a low memory usage limit",	8*Mi,	8*Mi),
			MemCase("_high_memory",	"; use a high memory usage limit",	128*Mi,	128*Mi)
		};

		TestCaseGroup* const mixedGroup = new TestCaseGroup(m_context, "mixed", "Mixed stress tests");
		addChild(mixedGroup);

		for (int memoryLimitNdx = 0; memoryLimitNdx < DE_LENGTH_OF_ARRAY(memoryLimitCases); memoryLimitNdx++)
		{
			mixedGroup->addChild(new gls::LongStressCase(m_context.getTestContext(), m_context.getRenderContext(),
														 (string() + "buffer_texture_wasteful"					+ memoryLimitCases[memoryLimitNdx].nameSuffix).c_str(),
														 (string() + "Use both buffers and textures wastefully"	+ memoryLimitCases[memoryLimitNdx].descSuffix).c_str(),
														 memoryLimitCases[memoryLimitNdx].texLimit, memoryLimitCases[memoryLimitNdx].bufLimit,
														 1 /* draw calls per iteration */, 10000 /* tris per call */,
														 std::vector<gls::ProgramContext>(1, progLib.generateBufferAndTextureContext(4, 512, 512)),
														 Probs()
														 .pReuploadTexture				(0.3f)
														 .pReuploadWithTexImage			(0.5f)
														 .pReuploadBuffer				(0.3f)
														 .pReuploadWithBufferData		(0.5f)
														 .pDeleteTexture				(0.2f)
														 .pDeleteBuffer					(0.2f)
														 .pWastefulTextureMemoryUsage	(0.5f)
														 .pWastefulBufferMemoryUsage	(0.5f)
														 .pRandomBufferUploadTarget		(1.0f)
														 .pRandomBufferUsage			(1.0f),
														 GL_STATIC_DRAW, GL_STATIC_DRAW));

			{
				std::vector<gls::ProgramContext> contexts;
				contexts.push_back(progLib.generateFragmentPointLightContext(512, 512));
				contexts.push_back(progLib.generateVertexUniformLoopLightContext(512, 512));
				mixedGroup->addChild(new gls::LongStressCase(m_context.getTestContext(), m_context.getRenderContext(),
															 (string() + "random"					+ memoryLimitCases[memoryLimitNdx].nameSuffix).c_str(),
															 (string() + "Highly random behavior"	+ memoryLimitCases[memoryLimitNdx].descSuffix).c_str(),
															  memoryLimitCases[memoryLimitNdx].texLimit, memoryLimitCases[memoryLimitNdx].bufLimit,
															 1 /* draw calls per iteration */, 10000 /* tris per call */,
															 contexts,
															 Probs()
															 .pRebuildProgram				(0.3f)
															 .pReuploadTexture				(0.3f)
															 .pReuploadWithTexImage			(0.3f)
															 .pReuploadBuffer				(0.3f)
															 .pReuploadWithBufferData		(0.3f)
															 .pDeleteTexture				(0.2f)
															 .pDeleteBuffer					(0.2f)
															 .pWastefulTextureMemoryUsage	(0.3f)
															 .pWastefulBufferMemoryUsage	(0.3f)
															 .pClientMemoryAttributeData	(0.2f)
															 .pClientMemoryIndexData		(0.2f)
															 .pSeparateAttribBuffers		(0.4f)
															 .pUseDrawArrays				(0.4f)
															 .pRandomBufferUploadTarget		(1.0f)
															 .pRandomBufferUsage			(1.0f),
															 GL_STATIC_DRAW, GL_STATIC_DRAW));
			}
		}
	}
}